

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_conversion.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_2::alpha_conversion_helper::treat_expressions(alpha_conversion_helper *this)

{
  alpha_conversion_data *this_00;
  uint64_t uVar1;
  value_type vVar2;
  pointer this_01;
  undefined8 uVar3;
  Let *pLVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  reference pvVar8;
  Set *pSVar9;
  reference pvVar10;
  FunCall *pFVar11;
  reference pvVar12;
  reference ppVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
  *this_02;
  reference this_03;
  reference pvVar14;
  string *psVar15;
  pointer ppVar16;
  PrimitiveCall *pPVar17;
  __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var18;
  element_type *peVar19;
  reference pvVar20;
  runtime_error *prVar21;
  value_type ind_1;
  undefined1 local_528 [8];
  Variable v_1;
  FunCall f;
  alpha_conversion_data new_name_3;
  PrimitiveCall *p;
  alpha_conversion_data local_420;
  string local_3f8;
  _Self local_3d8;
  _Self local_3d0;
  iterator it;
  alpha_conversion_data local_3a0;
  string local_378;
  undefined1 local_358 [8];
  alpha_conversion_data new_name_2;
  Set *s;
  alpha_conversion_data local_318;
  undefined1 local_2f0 [8];
  string adapted;
  string original;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>
  *binding;
  iterator __end7;
  iterator __begin7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
  *__range7;
  e_ac_state local_27c;
  pointer local_278;
  Let *local_270;
  Let *l_1;
  value_type ind;
  undefined1 local_250 [16];
  reverse_iterator rit_5;
  pointer local_238;
  Let *local_230;
  Let *l;
  undefined1 local_218 [16];
  reverse_iterator rit_4;
  alpha_conversion_state local_1f8;
  alpha_conversion_data local_1e8;
  undefined1 local_1c0 [8];
  string new_name_1;
  string *var_name;
  size_t i;
  e_ac_state local_17c;
  pointer local_178;
  Lambda *local_170;
  Lambda *lam;
  undefined1 local_158 [16];
  reverse_iterator rit_3;
  undefined1 local_138 [16];
  reverse_iterator rit_2;
  pointer local_120;
  alpha_conversion_state local_118;
  undefined1 local_108 [16];
  reverse_iterator rit_1;
  undefined1 local_e8 [16];
  reverse_iterator rit;
  e_ac_state local_c4;
  pointer local_c0;
  alpha_conversion_data local_b8;
  string local_90;
  undefined1 local_60 [8];
  alpha_conversion_data new_name;
  Variable *v;
  Expression *e;
  alpha_conversion_state st;
  alpha_conversion_helper *this_local;
  
  while( true ) {
    do {
      while( true ) {
        while( true ) {
          bVar5 = std::
                  vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                  ::empty(&this->expressions);
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            return;
          }
          pvVar8 = std::
                   vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                   ::back(&this->expressions);
          this_01 = (pointer)pvVar8->p_expr;
          uVar3 = *(undefined8 *)&pvVar8->state;
          std::
          vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
          ::pop_back(&this->expressions);
          st.p_expr._0_4_ = (int)uVar3;
          if ((int)st.p_expr != 0) break;
          bVar5 = std::
                  holds_alternative<std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              *)this_01);
          if (!bVar5) {
            bVar5 = std::
                    holds_alternative<skiwi::Variable,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                *)this_01);
            if (bVar5) {
              new_name._32_8_ =
                   std::
                   get<skiwi::Variable,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                             ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                               *)this_01);
              alpha_conversion_data::alpha_conversion_data((alpha_conversion_data *)local_60);
              p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::
                           vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                           ::back(&this->env);
              peVar19 = std::
                        __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var18);
              bVar5 = environment<skiwi::alpha_conversion_data>::find
                                (peVar19,(alpha_conversion_data *)local_60,
                                 (string *)(new_name._32_8_ + 8));
              if (!bVar5) {
                if ((this->modify_names & 1U) == 0) {
                  std::__cxx11::string::string((string *)&local_90,(string *)(new_name._32_8_ + 8));
                }
                else {
                  psVar15 = (string *)(new_name._32_8_ + 8);
                  pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                      (&this->index);
                  uVar1 = *pvVar20;
                  *pvVar20 = uVar1 + 1;
                  make_name(&local_90,this,psVar15,uVar1);
                }
                std::__cxx11::string::operator=((string *)local_60,(string *)&local_90);
                std::__cxx11::string::~string((string *)&local_90);
                new_name.name.field_2._M_local_buf[8] = '\x01';
                p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                             ::back(&this->env);
                peVar19 = std::
                          __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var18);
                psVar15 = (string *)(new_name._32_8_ + 8);
                alpha_conversion_data::alpha_conversion_data
                          (&local_b8,(alpha_conversion_data *)local_60);
                environment<skiwi::alpha_conversion_data>::push_outer(peVar19,psVar15,&local_b8);
                alpha_conversion_data::~alpha_conversion_data(&local_b8);
              }
              std::__cxx11::string::operator=((string *)(new_name._32_8_ + 8),(string *)local_60);
              alpha_conversion_data::~alpha_conversion_data((alpha_conversion_data *)local_60);
            }
            else {
              bVar5 = std::
                      holds_alternative<skiwi::Nop,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                  *)this_01);
              if ((!bVar5) &&
                 (bVar5 = std::
                          holds_alternative<skiwi::Quote,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                      *)this_01), !bVar5)) {
                bVar5 = std::
                        holds_alternative<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                    *)this_01);
                if (bVar5) {
                  local_c4 = T_STEP_1;
                  local_c0 = this_01;
                  std::
                  vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                  ::
                  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::alpha_conversion_state::e_ac_state>
                            ((vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                              *)this,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                      **)&local_c0,&local_c4);
                  pSVar9 = std::
                           get<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                     ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       *)this_01);
                  pvVar14 = std::
                            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                            ::front(&pSVar9->value);
                  alpha_conversion_state::alpha_conversion_state
                            ((alpha_conversion_state *)&rit,pvVar14);
                  std::
                  vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                  ::push_back(&this->expressions,(value_type *)&rit);
                }
                else {
                  bVar5 = std::
                          holds_alternative<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                      *)this_01);
                  if (bVar5) {
                    std::
                    get<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                *)this_01);
                    std::
                    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ::rbegin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                              *)(local_e8 + 8));
                    while( true ) {
                      std::
                      get<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                  *)this_01);
                      std::
                      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                      ::rend((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                              *)local_e8);
                      bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                               *)(local_e8 + 8),
                                              (reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                               *)local_e8);
                      if (!bVar5) break;
                      pvVar12 = std::
                                reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                             *)(local_e8 + 8));
                      alpha_conversion_state::alpha_conversion_state
                                ((alpha_conversion_state *)&rit_1,pvVar12);
                      std::
                      vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                      ::push_back(&this->expressions,(value_type *)&rit_1);
                      std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                    *)(local_e8 + 8));
                    }
                  }
                  else {
                    bVar5 = std::
                            holds_alternative<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                      ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                        *)this_01);
                    if (bVar5) {
                      std::
                      get<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                  *)this_01);
                      std::
                      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                      ::rbegin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                *)(local_108 + 8));
                      while( true ) {
                        std::
                        get<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                    *)this_01);
                        std::
                        vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                        ::rend((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                *)local_108);
                        bVar5 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                 *)(local_108 + 8),
                                                (reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                 *)local_108);
                        if (!bVar5) break;
                        pvVar12 = std::
                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                               *)(local_108 + 8));
                        alpha_conversion_state::alpha_conversion_state(&local_118,pvVar12);
                        std::
                        vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                        ::push_back(&this->expressions,&local_118);
                        std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                      *)(local_108 + 8));
                      }
                    }
                    else {
                      bVar5 = std::
                              holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                        ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                          *)this_01);
                      if (bVar5) {
                        rit_2.current._M_current._4_4_ = 1;
                        local_120 = this_01;
                        std::
                        vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                        ::
                        emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::alpha_conversion_state::e_ac_state>
                                  ((vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                                    *)this,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                            **)&local_120,
                                   (e_ac_state *)((long)&rit_2.current._M_current + 4));
                        std::
                        get<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                    *)this_01);
                        std::
                        vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                        ::rbegin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                  *)(local_138 + 8));
                        while( true ) {
                          std::
                          get<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                      *)this_01);
                          std::
                          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                          ::rend((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                  *)local_138);
                          bVar5 = std::operator!=((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)(local_138 + 8),
                                                  (
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)local_138);
                          if (!bVar5) break;
                          pvVar12 = std::
                                    reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                 *)(local_138 + 8));
                          alpha_conversion_state::alpha_conversion_state
                                    ((alpha_conversion_state *)&rit_3,pvVar12);
                          std::
                          vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                          ::push_back(&this->expressions,(value_type *)&rit_3);
                          std::
                          reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                        *)(local_138 + 8));
                        }
                      }
                      else {
                        bVar5 = std::
                                holds_alternative<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                          ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                            *)this_01);
                        if (bVar5) {
                          std::
                          get<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                      *)this_01);
                          std::
                          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                          ::rbegin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                    *)(local_158 + 8));
                          while( true ) {
                            std::
                            get<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                      ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                        *)this_01);
                            std::
                            vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                            ::rend((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                    *)local_158);
                            bVar5 = std::operator!=((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)(local_158 + 8),
                                                  (
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)local_158);
                            if (!bVar5) break;
                            pvVar12 = std::
                                      reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                      ::operator*((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)(local_158 + 8));
                            alpha_conversion_state::alpha_conversion_state
                                      ((alpha_conversion_state *)&lam,pvVar12);
                            std::
                            vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                            ::push_back(&this->expressions,(value_type *)&lam);
                            std::
                            reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                          *)(local_158 + 8));
                          }
                        }
                        else {
                          bVar5 = std::
                                  holds_alternative<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                            ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                              *)this_01);
                          if (bVar5) {
                            local_170 = std::
                                        get<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                                  ((
                                                  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                  *)this_01);
                            local_17c = T_STEP_1;
                            local_178 = this_01;
                            std::
                            vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                            ::
                            emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::alpha_conversion_state::e_ac_state>
                                      ((vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                                        *)this,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                **)&local_178,&local_17c);
                            pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      back(&this->index);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                                      (&this->index,pvVar20);
                            std::
                            vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                            ::back(&this->env);
                            std::
                            make_shared<skiwi::environment<skiwi::alpha_conversion_data>,std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>>&>
                                      ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>
                                        *)&i);
                            std::
                            vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                            ::push_back(&this->env,
                                        (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>
                                         *)&i);
                            std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::
                            ~shared_ptr((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>
                                         *)&i);
                            for (var_name = (string *)0x0;
                                psVar15 = (string *)
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::size(&local_170->variables), var_name < psVar15;
                                var_name = (string *)&var_name->field_0x1) {
                              pvVar10 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](&local_170->variables,(size_type)var_name);
                              new_name_1.field_2._8_8_ = pvVar10;
                              if ((this->modify_names & 1U) == 0) {
                                std::__cxx11::string::string((string *)local_1c0,(string *)pvVar10);
                              }
                              else {
                                pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::back(&this->index);
                                uVar1 = *pvVar20;
                                *pvVar20 = uVar1 + 1;
                                make_name((string *)local_1c0,this,pvVar10,uVar1);
                              }
                              p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)std::
                                           vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                                           ::back(&this->env);
                              peVar19 = std::
                                        __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator->(p_Var18);
                              uVar3 = new_name_1.field_2._8_8_;
                              alpha_conversion_data::alpha_conversion_data
                                        (&local_1e8,(string *)local_1c0);
                              environment<skiwi::alpha_conversion_data>::push
                                        (peVar19,(string *)uVar3,&local_1e8);
                              alpha_conversion_data::~alpha_conversion_data(&local_1e8);
                              pvVar10 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](&local_170->variables,(size_type)var_name);
                              std::__cxx11::string::operator=((string *)pvVar10,(string *)local_1c0)
                              ;
                              std::__cxx11::string::~string((string *)local_1c0);
                            }
                            pvVar14 = std::
                                      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                      ::front(&local_170->body);
                            alpha_conversion_state::alpha_conversion_state(&local_1f8,pvVar14);
                            std::
                            vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                            ::push_back(&this->expressions,&local_1f8);
                          }
                          else {
                            bVar5 = std::
                                    holds_alternative<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                              ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                *)this_01);
                            if (bVar5) {
                              pFVar11 = std::
                                        get<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                                  ((
                                                  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                  *)this_01);
                              pvVar14 = std::
                                        vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                        ::front(&pFVar11->fun);
                              alpha_conversion_state::alpha_conversion_state
                                        ((alpha_conversion_state *)&rit_4,pvVar14);
                              std::
                              vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                              ::push_back(&this->expressions,(value_type *)&rit_4);
                              std::
                              get<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                        ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                          *)this_01);
                              std::
                              vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                              ::rbegin((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                        *)(local_218 + 8));
                              while( true ) {
                                std::
                                get<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                          ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                            *)this_01);
                                std::
                                vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                ::rend((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                        *)local_218);
                                bVar5 = std::operator!=((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)(local_218 + 8),
                                                  (
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)local_218);
                                if (!bVar5) break;
                                pvVar12 = std::
                                          reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                          ::operator*((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                                  *)(local_218 + 8));
                                alpha_conversion_state::alpha_conversion_state
                                          ((alpha_conversion_state *)&l,pvVar12);
                                std::
                                vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                                ::push_back(&this->expressions,(value_type *)&l);
                                std::
                                reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                              *)(local_218 + 8));
                              }
                            }
                            else {
                              bVar5 = std::
                                      holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                                ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                  *)this_01);
                              if (!bVar5) {
                                prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar21,
                                           "Compiler error!: alpha conversion: not implemented");
                                __cxa_throw(prVar21,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              local_230 = std::
                                          get<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                                    ((
                                                  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                  *)this_01);
                              rit_5.current._M_current._4_4_ = 1;
                              local_238 = this_01;
                              std::
                              vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                              ::
                              emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::alpha_conversion_state::e_ac_state>
                                        ((vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                                          *)this,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                                  **)&local_238,
                                         (e_ac_state *)((long)&rit_5.current._M_current + 4));
                              std::
                              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                              ::rbegin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                        *)(local_250 + 8));
                              while( true ) {
                                std::
                                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                ::rend((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                        *)local_250);
                                bVar5 = std::operator!=((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                                  *)(local_250 + 8),
                                                  (
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                                  *)local_250);
                                if (!bVar5) break;
                                ppVar13 = std::
                                          reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                          ::operator*((
                                                  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                                  *)(local_250 + 8));
                                alpha_conversion_state::alpha_conversion_state
                                          ((alpha_conversion_state *)&ind,&ppVar13->second);
                                std::
                                vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
                                ::push_back(&this->expressions,(value_type *)&ind);
                                std::
                                reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>_>
                                              *)(local_250 + 8));
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((int)st.p_expr != 1) break;
        bVar5 = std::
                holds_alternative<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                            *)this_01);
        if (bVar5) {
          pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
          l_1 = (Let *)*pvVar20;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->index);
          pLVar4 = l_1;
          pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
          *pvVar20 = (value_type)pLVar4;
          std::
          vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
          ::pop_back(&this->env);
        }
        else {
          bVar5 = std::
                  holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                              *)this_01);
          if (bVar5) {
            local_270 = std::
                        get<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                    *)this_01);
            local_27c = T_STEP_2;
            local_278 = this_01;
            std::
            vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
            ::
            emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>*,skiwi::(anonymous_namespace)::alpha_conversion_state::e_ac_state>
                      ((vector<skiwi::(anonymous_namespace)::alpha_conversion_state,std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>>
                        *)this,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                **)&local_278,&local_27c);
            pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index)
            ;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&this->index,pvVar20);
            std::
            vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
            ::back(&this->env);
            std::
            make_shared<skiwi::environment<skiwi::alpha_conversion_data>,std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>>&>
                      ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range7);
            std::
            vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
            ::push_back(&this->env,
                        (shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range7);
            std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>::~shared_ptr
                      ((shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> *)&__range7);
            this_02 = &local_270->bindings;
            __end7 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                     ::begin(this_02);
            binding = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>
                       *)std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                         ::end(this_02);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                                               *)&binding), bVar5) {
              this_03 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
                        ::operator*(&__end7);
              std::__cxx11::string::string
                        ((string *)(adapted.field_2._M_local_buf + 8),(string *)this_03);
              if ((this->modify_names & 1U) == 0) {
                std::__cxx11::string::string
                          ((string *)local_2f0,(string *)(adapted.field_2._M_local_buf + 8));
              }
              else {
                pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                    (&this->index);
                uVar1 = *pvVar20;
                *pvVar20 = uVar1 + 1;
                make_name((string *)local_2f0,this,(string *)((long)&adapted.field_2 + 8),uVar1);
              }
              p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::
                           vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                           ::back(&this->env);
              peVar19 = std::
                        __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var18);
              alpha_conversion_data::alpha_conversion_data(&local_318,(string *)local_2f0);
              environment<skiwi::alpha_conversion_data>::push
                        (peVar19,(string *)((long)&adapted.field_2 + 8),&local_318);
              alpha_conversion_data::~alpha_conversion_data(&local_318);
              std::__cxx11::string::operator=((string *)this_03,(string *)local_2f0);
              std::__cxx11::string::~string((string *)local_2f0);
              std::__cxx11::string::~string((string *)(adapted.field_2._M_local_buf + 8));
              __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>_>
              ::operator++(&__end7);
            }
            pvVar14 = std::
                      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                      ::front(&local_270->body);
            alpha_conversion_state::alpha_conversion_state((alpha_conversion_state *)&s,pvVar14);
            std::
            vector<skiwi::(anonymous_namespace)::alpha_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::alpha_conversion_state>_>
            ::push_back(&this->expressions,(value_type *)&s);
          }
          else {
            bVar5 = std::
                    holds_alternative<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                *)this_01);
            if (bVar5) {
              new_name_2._32_8_ =
                   std::
                   get<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                             ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                               *)this_01);
              alpha_conversion_data::alpha_conversion_data((alpha_conversion_data *)local_358);
              if (((*(byte *)(new_name_2._32_8_ + 0x41) & 1) == 0) &&
                 ((*(byte *)(new_name_2._32_8_ + 0x42) & 1) == 0)) {
                p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                             ::back(&this->env);
                peVar19 = std::
                          __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var18);
                bVar5 = environment<skiwi::alpha_conversion_data>::find
                                  (peVar19,(alpha_conversion_data *)local_358,
                                   (string *)(new_name_2._32_8_ + 8));
                if (bVar5) {
                  std::__cxx11::string::operator=
                            ((string *)(new_name_2._32_8_ + 8),(string *)local_358);
                }
                else {
                  if (((anonymous_namespace)::alpha_conversion_helper::treat_expressions()::
                       expr_map_abi_cxx11_ == '\0') &&
                     (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::alpha_conversion_helper::
                                                   treat_expressions()::expr_map_abi_cxx11_),
                     iVar7 != 0)) {
                    generate_expression_map_abi_cxx11_();
                    __cxa_atexit(std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type>_>_>
                                 ::~map,&(anonymous_namespace)::alpha_conversion_helper::
                                         treat_expressions()::expr_map_abi_cxx11_,&__dso_handle);
                    __cxa_guard_release(&(anonymous_namespace)::alpha_conversion_helper::
                                         treat_expressions()::expr_map_abi_cxx11_);
                  }
                  local_3d0._M_node =
                       (_Base_ptr)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type>_>_>
                       ::find(&(anonymous_namespace)::alpha_conversion_helper::treat_expressions()::
                               expr_map_abi_cxx11_,(key_type *)(new_name_2._32_8_ + 8));
                  local_3d8._M_node =
                       (_Base_ptr)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type>_>_>
                       ::end(&(anonymous_namespace)::alpha_conversion_helper::treat_expressions()::
                              expr_map_abi_cxx11_);
                  bVar6 = std::operator!=(&local_3d0,&local_3d8);
                  bVar5 = false;
                  if (bVar6) {
                    ppVar16 = std::
                              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::expression_type>_>
                              ::operator->(&local_3d0);
                    bVar5 = ppVar16->second == et_primitive_call;
                  }
                  if (bVar5) {
                    if ((this->modify_names & 1U) == 0) {
                      std::__cxx11::string::string
                                ((string *)&local_3f8,(string *)(new_name_2._32_8_ + 8));
                    }
                    else {
                      psVar15 = (string *)(new_name_2._32_8_ + 8);
                      pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                          (&this->index);
                      uVar1 = *pvVar20;
                      *pvVar20 = uVar1 + 1;
                      make_name(&local_3f8,this,psVar15,uVar1);
                    }
                    std::__cxx11::string::operator=((string *)local_358,(string *)&local_3f8);
                    std::__cxx11::string::~string((string *)&local_3f8);
                    p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)std::
                                 vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                                 ::back(&this->env);
                    peVar19 = std::
                              __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->(p_Var18);
                    psVar15 = (string *)(new_name_2._32_8_ + 8);
                    alpha_conversion_data::alpha_conversion_data
                              (&local_420,(alpha_conversion_data *)local_358);
                    environment<skiwi::alpha_conversion_data>::push(peVar19,psVar15,&local_420);
                    alpha_conversion_data::~alpha_conversion_data(&local_420);
                    std::__cxx11::string::operator=
                              ((string *)(new_name_2._32_8_ + 8),(string *)local_358);
                    *(undefined1 *)(new_name_2._32_8_ + 0x41) = 1;
                  }
                  else {
                    p = (PrimitiveCall *)new_name_2._32_8_;
                    std::vector<skiwi::Set_*,_std::allocator<skiwi::Set_*>_>::push_back
                              ((vector<skiwi::Set_*,_std::allocator<skiwi::Set_*>_> *)
                               (anonymous_namespace)::g_unhandled_sets,(value_type *)&p);
                  }
                }
              }
              else {
                p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                             ::back(&this->env);
                peVar19 = std::
                          __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var18);
                bVar5 = environment<skiwi::alpha_conversion_data>::find
                                  (peVar19,(alpha_conversion_data *)local_358,
                                   (string *)(new_name_2._32_8_ + 8));
                if (bVar5) {
                  if ((new_name_2.name.field_2._M_local_buf[8] & 1U) == 0) {
                    *(undefined1 *)(new_name_2._32_8_ + 0x41) = 0;
                  }
                  else {
                    new_name_2.name.field_2._M_local_buf[8] = '\0';
                    p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)std::
                                 vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                                 ::back(&this->env);
                    peVar19 = std::
                              __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->(p_Var18);
                    psVar15 = (string *)(new_name_2._32_8_ + 8);
                    alpha_conversion_data::alpha_conversion_data
                              ((alpha_conversion_data *)&it,(alpha_conversion_data *)local_358);
                    environment<skiwi::alpha_conversion_data>::push
                              (peVar19,psVar15,(alpha_conversion_data *)&it);
                    alpha_conversion_data::~alpha_conversion_data((alpha_conversion_data *)&it);
                  }
                }
                else {
                  if ((this->modify_names & 1U) == 0) {
                    std::__cxx11::string::string
                              ((string *)&local_378,(string *)(new_name_2._32_8_ + 8));
                  }
                  else {
                    psVar15 = (string *)(new_name_2._32_8_ + 8);
                    pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                                        (&this->index);
                    uVar1 = *pvVar20;
                    *pvVar20 = uVar1 + 1;
                    make_name(&local_378,this,psVar15,uVar1);
                  }
                  std::__cxx11::string::operator=((string *)local_358,(string *)&local_378);
                  std::__cxx11::string::~string((string *)&local_378);
                  p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)std::
                               vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                               ::back(&this->env);
                  peVar19 = std::
                            __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->(p_Var18);
                  psVar15 = (string *)(new_name_2._32_8_ + 8);
                  alpha_conversion_data::alpha_conversion_data
                            (&local_3a0,(alpha_conversion_data *)local_358);
                  environment<skiwi::alpha_conversion_data>::push(peVar19,psVar15,&local_3a0);
                  alpha_conversion_data::~alpha_conversion_data(&local_3a0);
                }
                std::__cxx11::string::operator=
                          ((string *)(new_name_2._32_8_ + 8),(string *)local_358);
              }
              alpha_conversion_data::~alpha_conversion_data((alpha_conversion_data *)local_358);
            }
            else {
              bVar5 = std::
                      holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                  *)this_01);
              if (!bVar5) {
                prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar21,"Compiler error!: alpha conversion: not implemented");
                __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pPVar17 = std::
                        get<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                    *)this_01);
              this_00 = (alpha_conversion_data *)((long)&f.filename.field_2 + 8);
              alpha_conversion_data::alpha_conversion_data(this_00);
              p_Var18 = (__shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::
                           vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
                           ::back(&this->env);
              peVar19 = std::
                        __shared_ptr_access<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var18);
              bVar5 = environment<skiwi::alpha_conversion_data>::find
                                (peVar19,this_00,&pPVar17->primitive_name);
              if (bVar5) {
                FunCall::FunCall((FunCall *)((long)&v_1.filename.field_2 + 8));
                Variable::Variable((Variable *)local_528);
                std::__cxx11::string::operator=
                          ((string *)&v_1,(string *)(f.filename.field_2._M_local_buf + 8));
                std::
                variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                ::variant<skiwi::Variable&,void,void,skiwi::Variable,void>
                          ((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            *)&ind_1,(Variable *)local_528);
                std::
                vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                             *)&f.arguments.
                                super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)&ind_1);
                std::
                variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                ::~variant((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                            *)&ind_1);
                std::
                vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ::operator=((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                             *)&f,&pPVar17->arguments);
                if ((pPVar17->as_object & 1U) == 0) {
                  std::
                  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                  ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                               *)this_01,(FunCall *)((long)&v_1.filename.field_2 + 8));
                }
                else {
                  std::
                  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                  ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                               *)this_01,(Variable *)local_528);
                }
                Variable::~Variable((Variable *)local_528);
                FunCall::~FunCall((FunCall *)((long)&v_1.filename.field_2 + 8));
              }
              alpha_conversion_data::~alpha_conversion_data
                        ((alpha_conversion_data *)((long)&f.filename.field_2 + 8));
            }
          }
        }
      }
    } while ((int)st.p_expr != 2);
    bVar5 = std::
            holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                      ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                        *)this_01);
    if (!bVar5) break;
    pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
    vVar2 = *pvVar20;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->index);
    pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->index);
    *pvVar20 = vVar2;
    std::
    vector<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>,_std::allocator<std::shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_>_>_>
    ::pop_back(&this->env);
  }
  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar21,"Compiler error!: alpha conversion: not implemented");
  __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void treat_expressions()
      {
      while (!expressions.empty())
        {
        alpha_conversion_state st = expressions.back();
        expressions.pop_back();
        Expression& e = *st.p_expr;

        switch (st.state)
          {
          case alpha_conversion_state::e_ac_state::T_INIT:
          {
          if (std::holds_alternative<Literal>(e))
            {

            }
          else if (std::holds_alternative<Variable>(e))
            {
            Variable& v = std::get<Variable>(e);
            alpha_conversion_data new_name;
            if (!env.back()->find(new_name, v.name)) // variables are already used in a context with the variable being defined later
              {
              //throw_error(v.line_nr, v.column_nr, v.filename, primitive_unknown, v.name);
              new_name.name = modify_names ? make_name(v.name, index.back()++) : v.name;
              new_name.forward_declaration = true;
              env.back()->push_outer(v.name, new_name);
              }
            v.name = new_name.name;
            }
          else if (std::holds_alternative<Nop>(e))
            {

            }
          else if (std::holds_alternative<Quote>(e))
            {

            }
          else if (std::holds_alternative<Set>(e))
            {
            //Set& s = std::get<Set>(e);
            expressions.emplace_back(&e, alpha_conversion_state::e_ac_state::T_STEP_1);
            expressions.push_back(&std::get<Set>(e).value.front());
            }
          else if (std::holds_alternative<If>(e))
            {
            for (auto rit = std::get<If>(e).arguments.rbegin(); rit != std::get<If>(e).arguments.rend(); ++rit)
              expressions.push_back(&(*rit));
            }
          else if (std::holds_alternative<Begin>(e))
            {
            for (auto rit = std::get<Begin>(e).arguments.rbegin(); rit != std::get<Begin>(e).arguments.rend(); ++rit)
              expressions.push_back(&(*rit));
            }
          else if (std::holds_alternative<PrimitiveCall>(e))
            {
            expressions.emplace_back(&e, alpha_conversion_state::e_ac_state::T_STEP_1);
            for (auto rit = std::get<PrimitiveCall>(e).arguments.rbegin(); rit != std::get<PrimitiveCall>(e).arguments.rend(); ++rit)
              expressions.push_back(&(*rit));
            }
          else if (std::holds_alternative<ForeignCall>(e))
            {
            for (auto rit = std::get<ForeignCall>(e).arguments.rbegin(); rit != std::get<ForeignCall>(e).arguments.rend(); ++rit)
              expressions.push_back(&(*rit));
            }
          else if (std::holds_alternative<Lambda>(e))
            {
            Lambda& lam = std::get<Lambda>(e);
            expressions.emplace_back(&e, alpha_conversion_state::e_ac_state::T_STEP_1);
            //alpha_conversion_visitor new_visitor(index, env, modify_names);

            index.push_back(index.back());
            env.push_back(std::make_shared<environment<alpha_conversion_data>>(env.back()));

            for (size_t i = 0; i < lam.variables.size(); ++i)
              {
              std::string& var_name = lam.variables[i];
              std::string new_name = modify_names ? make_name(var_name, index.back()++) : var_name;
              env.back()->push(var_name, new_name);
              lam.variables[i] = new_name;
              }
            //visitor<Expression, alpha_conversion_visitor>::visit(lam.body.front(), &new_visitor);
            //index = new_visitor.index;            
            expressions.push_back(&lam.body.front());
            }
          else if (std::holds_alternative<FunCall>(e))
            {
            expressions.push_back(&std::get<FunCall>(e).fun.front());
            for (auto rit = std::get<FunCall>(e).arguments.rbegin(); rit != std::get<FunCall>(e).arguments.rend(); ++rit)
              expressions.push_back(&(*rit));
            }
          else if (std::holds_alternative<Let>(e))
            {
            Let& l = std::get<Let>(e);
            expressions.emplace_back(&e, alpha_conversion_state::e_ac_state::T_STEP_1);
            //expressions.push_back(&l.body.front());
            for (auto rit = l.bindings.rbegin(); rit != l.bindings.rend(); ++rit)
              expressions.push_back(&(*rit).second);
            }
          else
            throw std::runtime_error("Compiler error!: alpha conversion: not implemented");
          break;
          }
          case alpha_conversion_state::e_ac_state::T_STEP_1:
          {
          if (std::holds_alternative<Lambda>(e))
            {
            auto ind = index.back();
            index.pop_back();
            index.back() = ind;
            env.pop_back();
            }
          else if (std::holds_alternative<Let>(e))
            {
            Let& l = std::get<Let>(e);
            expressions.emplace_back(&e, alpha_conversion_state::e_ac_state::T_STEP_2);
            index.push_back(index.back());
            env.push_back(std::make_shared<environment<alpha_conversion_data>>(env.back()));
            for (auto& binding : l.bindings)
              {
              std::string original = binding.first;
              std::string adapted = modify_names ? make_name(original, index.back()++) : original;
              env.back()->push(original, adapted);
              binding.first = adapted;
              }

            expressions.push_back(&l.body.front());
            }
          else if (std::holds_alternative<Set>(e))
            {
            Set& s = std::get<Set>(e);
            alpha_conversion_data new_name;

            if (s.originates_from_define || s.originates_from_quote)
              {
              if (!env.back()->find(new_name, s.name))
                {
                new_name.name = modify_names ? make_name(s.name, index.back()++) : s.name;
                env.back()->push(s.name, new_name);
                }
              else
                {
                if (new_name.forward_declaration) // this variable was forward declared, but now it is also defined, so set forward_declaration to false.
                  {
                  new_name.forward_declaration = false;
                  env.back()->push(s.name, new_name);
                  }
                else
                  s.originates_from_define = false; // was already defined before, therefore, treat this define as a set!
                }
              s.name = new_name.name;
              }
            else if (!env.back()->find(new_name, s.name))
              {
              static std::map<std::string, expression_type> expr_map = generate_expression_map();
              auto it = expr_map.find(s.name);
              if (it != expr_map.end() && it->second == et_primitive_call)
                { // we're setting a primitive call, convert it to a define
                new_name.name = modify_names ? make_name(s.name, index.back()++) : s.name;
                env.back()->push(s.name, new_name);
                s.name = new_name.name;
                s.originates_from_define = true;
                }
              else
                g_unhandled_sets.push_back(&s);
              }
            else
              s.name = new_name.name;
            }
          else if (std::holds_alternative<PrimitiveCall>(e))
            {
            PrimitiveCall& p = std::get<PrimitiveCall>(e);
            alpha_conversion_data new_name;
            if (env.back()->find(new_name, p.primitive_name)) // it is possible that a primitive name has been redefined. That case is treated here.
              {
              FunCall f;
              Variable v;
              v.name = new_name.name;
              f.fun.push_back(v);
              f.arguments = p.arguments;
              if (p.as_object)
                e = v;
              else
                e = f;
              }
            }
          else
            throw std::runtime_error("Compiler error!: alpha conversion: not implemented");
          break;
          }
          case alpha_conversion_state::e_ac_state::T_STEP_2:
          {
          if (std::holds_alternative<Let>(e))
            {
            auto ind = index.back();
            index.pop_back();
            index.back() = ind;
            env.pop_back();
            }
          else
            throw std::runtime_error("Compiler error!: alpha conversion: not implemented");
          break;
          }
          }
        }
      }